

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CryptoHelperLinux.cpp
# Opt level: O3

void __thiscall license::CryptoHelperLinux::CryptoHelperLinux(CryptoHelperLinux *this)

{
  this->_vptr_CryptoHelperLinux = (_func_int **)&PTR_generateKeyPair_00106d30;
  this->rsa = (RSA *)0x0;
  if (CryptoHelperLinux()::initialized != '\0') {
    return;
  }
  CryptoHelperLinux()::initialized = 1;
  ERR_load_ERR_strings();
  OPENSSL_init_crypto(2,0);
  OPENSSL_init_crypto(0xc,0);
  return;
}

Assistant:

CryptoHelperLinux::CryptoHelperLinux() {
	static int initialized = 0;
	rsa = NULL;
	if (initialized == 0) {
		initialized = 1;
		ERR_load_ERR_strings();
		ERR_load_crypto_strings();
		OpenSSL_add_all_algorithms();
	}

}